

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  allocator local_53;
  char local_52 [6];
  char cStack_4c;
  char cStack_4b;
  char formatString [6];
  int len;
  char buffer [36];
  uint precision_local;
  bool useSpecialFloats_local;
  double value_local;
  
  cStack_4c = -1;
  cStack_4b = -1;
  formatString[0] = -1;
  formatString[1] = -1;
  sprintf(local_52,"%%.%dg",CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
  bVar1 = std::isfinite(value);
  if (bVar1) {
    _cStack_4c = snprintf(formatString + 2,0x24,local_52,value);
    pcVar2 = strstr(formatString + 2,".");
    if ((pcVar2 == (char *)0x0) && (pcVar2 = strstr(formatString + 2,"e"), pcVar2 == (char *)0x0)) {
      strcat(formatString + 2,".0");
    }
  }
  else if (NAN(value)) {
    pcVar2 = "null";
    if (((ulong)this & 1) != 0) {
      pcVar2 = "NaN";
    }
    _cStack_4c = snprintf(formatString + 2,0x24,pcVar2);
  }
  else if (0.0 <= value) {
    pcVar2 = "-1e+9999";
    if (((ulong)this & 1) != 0) {
      pcVar2 = "-Infinity";
    }
    _cStack_4c = snprintf(formatString + 2,0x24,pcVar2 + 1);
  }
  else {
    pcVar2 = "-1e+9999";
    if (((ulong)this & 1) != 0) {
      pcVar2 = "-Infinity";
    }
    _cStack_4c = snprintf(formatString + 2,0x24,pcVar2);
  }
  if (-1 < _cStack_4c) {
    fixNumericLocale(formatString + 2,formatString + (long)_cStack_4c + 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,formatString + 2,&local_53);
    std::allocator<char>::~allocator((allocator<char> *)&local_53);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                ,0x1098,
                "std::string Json::(anonymous namespace)::valueToString(double, bool, unsigned int)"
               );
}

Assistant:

JSONCPP_STRING valueToString(double value, bool useSpecialFloats, unsigned int precision) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[36];
  int len = -1;

  char formatString[6];
  sprintf(formatString, "%%.%dg", precision);

  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distingish the
  // concepts of reals and integers.
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), formatString, value);
    
    // try to ensure we preserve the fact that this was given to us as a double on input
    if (!strstr(buffer, ".") && !strstr(buffer, "e")) {
      strcat(buffer, ".0");
    }

  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "NaN" : "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "-Infinity" : "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "Infinity" : "1e+9999");
    }
    // For those, we do not need to call fixNumLoc, but it is fast.
  }
  assert(len >= 0);
  fixNumericLocale(buffer, buffer + len);
  return buffer;
}